

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_list.cc
# Opt level: O1

Header * __thiscall
wave::HeaderList::header(Header *__return_storage_ptr__,HeaderList *this,string *header_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  Iterator IVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  Iterator IVar8;
  Iterator IVar9;
  Iterator iterator;
  Iterator local_60;
  string local_50;
  
  local_60.position_ = 0;
  local_60.stream_ = &this->stream_;
  IVar8 = end(this);
  bVar7 = IVar8.stream_ == &this->stream_;
  bVar3 = IVar8.position_ == 0;
  bVar6 = bVar7 && bVar3;
  if (!bVar7 || !bVar3) {
    paVar1 = &(__return_storage_ptr__->id_).field_2;
    do {
      Iterator::operator*(__return_storage_ptr__,&local_60);
      Header::chunk_id_abi_cxx11_(&local_50,__return_storage_ptr__);
      if (local_50._M_string_length == header_id->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar5 = bcmp(local_50._M_dataplus._M_p,(header_id->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar7 = iVar5 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        if (!bVar6) {
          return __return_storage_ptr__;
        }
        break;
      }
      pcVar2 = (__return_storage_ptr__->id_)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      Iterator::operator++(&local_60);
      IVar9 = end(this);
      IVar4.position_ = local_60.position_;
      IVar4.stream_ = local_60.stream_;
      IVar8.position_ = local_60.position_;
      IVar8.stream_ = local_60.stream_;
      bVar6 = IVar9 == IVar8;
    } while (IVar9 != IVar4);
  }
  local_50._M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)this;
  Iterator::operator*(__return_storage_ptr__,(Iterator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Header HeaderList::header(const std::string& header_id) {
  for (auto iterator = begin(); iterator != end(); iterator++) {
    auto header = *iterator;
    if (header.chunk_id() == header_id) {
      return header;
    }
  }
  return *begin();
}